

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall blc::network::Socket::~Socket(Socket *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_write_00130b88;
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    ::close(*(int *)(in_RDI + 1));
  }
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  return;
}

Assistant:

blc::network::Socket::~Socket() {
	if (this->_opened)
		::close(this->_socket);
}